

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O3

TestCaseGroup * deqp::gles31::Functional::createCopyImageTests(Context *context)

{
  TestCaseGroup *this;
  
  this = (TestCaseGroup *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,context->m_testCtx,"copy_image",
             "Copy image tests for GL_EXT_copy_image.");
  this->m_context = context;
  (this->super_TestCaseGroup).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_021715b0;
  return this;
}

Assistant:

TestCaseGroup* createCopyImageTests (Context& context)
{
	return new CopyImageTests(context);
}